

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O2

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  size_t size_00;
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long depth;
  long lVar13;
  long depth_00;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long j;
  long lVar17;
  long lVar18;
  double *pdVar19;
  ulong uVar20;
  double *pdVar21;
  long i3;
  long lVar22;
  long lVar23;
  double dVar24;
  double dStack_1b8;
  ptrdiff_t local_1b0;
  ptrdiff_t l1;
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  ptrdiff_t l2;
  long startTarget;
  double *local_100;
  double *local_e8;
  long local_d8;
  double *local_d0;
  double *local_c0;
  double *local_b8;
  RhsScalar *local_88;
  long cols;
  ResScalar *local_70;
  long actual_kc;
  long local_50;
  long k2;
  double *local_40;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> local_33;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_31 [6];
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  
  pdVar7 = &dStack_1b8;
  lVar2 = blocking->m_kc;
  lVar18 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar18 = size;
  }
  pdVar19 = (double *)(lVar18 * lVar2);
  if ((ulong)pdVar19 >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  pdVar21 = (double *)(lVar2 * otherSize);
  local_40 = blocking->m_blockA;
  uVar20 = (long)pdVar19 * 8;
  if (local_40 == (LhsScalar *)0x0) {
    if (uVar20 < 0x20001) {
      l1 = (long)&dStack_1b8 - (uVar20 + 0xf & 0xfffffffffffffff0);
      blockA_stack_memory_destructor.m_size._0_1_ = false;
      pdVar7 = (double *)l1;
      local_40 = (double *)l1;
    }
    else {
      local_40 = (double *)aligned_malloc(uVar20);
      l1 = (ptrdiff_t)(double *)0x0;
      if (blocking->m_blockA == (LhsScalar *)0x0) {
        l1 = (ptrdiff_t)local_40;
      }
      blockA_stack_memory_destructor.m_size._0_1_ = true;
    }
  }
  else {
    blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < uVar20;
    l1 = 0;
    pdVar7 = &dStack_1b8;
  }
  blockA_stack_memory_destructor.m_ptr = pdVar19;
  if ((double *)0x1fffffffffffffff < pdVar21) {
    pdVar7[-1] = 5.64161703410619e-318;
    throw_std_bad_alloc();
  }
  size_00 = (long)pdVar21 * 8;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (size_00 < 0x20001) {
      pdVar7 = (double *)((long)pdVar7 - (size_00 + 0xf & 0xfffffffffffffff0));
      blockA_stack_memory_destructor._16_8_ = pdVar7;
      cols = (long)pdVar7;
    }
    else {
      pdVar7[-1] = 5.64194311743245e-318;
      cols = (long)aligned_malloc(size_00);
      blockA_stack_memory_destructor._16_8_ = (undefined1 *)0x0;
      if (blocking->m_blockB == (RhsScalar *)0x0) {
        blockA_stack_memory_destructor._16_8_ = cols;
      }
    }
  }
  else {
    blockA_stack_memory_destructor._16_8_ = (undefined1 *)0x0;
    cols = (long)blocking->m_blockB;
  }
  blockB_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_00;
  blockB_stack_memory_destructor.m_ptr = pdVar21;
  if ((double *)0x1fffffffffffffff < (double *)(lVar2 * 8)) {
    *(undefined8 *)((long)pdVar7 + -8) = 0x116d08;
    throw_std_bad_alloc();
  }
  uVar20 = lVar2 * 0x40;
  if (blocking->m_blockW == (RhsScalar *)0x0) {
    if (uVar20 < 0x20001) {
      pdVar7 = (double *)((long)pdVar7 + lVar2 * -0x40);
      blockB_stack_memory_destructor._16_8_ = pdVar7;
      local_88 = pdVar7;
    }
    else {
      *(undefined8 *)((long)pdVar7 + -8) = 0x116d4e;
      local_88 = (RhsScalar *)aligned_malloc(uVar20);
      blockB_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
      if (blocking->m_blockW == (RhsScalar *)0x0) {
        blockB_stack_memory_destructor._16_8_ = local_88;
      }
    }
  }
  else {
    blockB_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
    local_88 = blocking->m_blockW;
  }
  blockW_stack_memory_destructor.m_size._0_1_ = 0x20000 < uVar20;
  blockW_stack_memory_destructor.m_ptr = (double *)(lVar2 * 8);
  pdVar7[-1] = 5.64304488382267e-318;
  manage_caching_sizes
            (GetAction,&local_1b0,(ptrdiff_t *)&blockW_stack_memory_destructor.m_deallocate);
  pdVar7[-1] = 1.97626258336499e-323;
  if (otherSize < 1) {
    lVar11 = 0;
  }
  else {
    lVar11 = (long)((ulong)blockW_stack_memory_destructor._16_8_ / (ulong)(otherStride << 5)) /
             (long)pdVar7[-1] << 2;
  }
  if (lVar11 < 5) {
    lVar11 = (long)pdVar7[-1];
  }
  local_e8 = _tri + (size + -1) * triStride + size;
  pdVar19 = _other + size;
  local_d8 = size - lVar2;
  local_d0 = _tri + triStride * local_d8;
  local_50 = size;
  while( true ) {
    depth_00 = local_50;
    if (lVar2 < local_50) {
      depth_00 = lVar2;
    }
    if (local_50 < 1) break;
    local_b8 = pdVar19;
    for (lVar9 = 0; lVar4 = otherSize - lVar9, lVar4 != 0 && lVar9 <= otherSize;
        lVar9 = lVar9 + lVar11) {
      if (lVar11 < lVar4) {
        lVar4 = lVar11;
      }
      pdVar21 = (double *)(cols + lVar9 * depth_00 * 8);
      local_100 = local_b8;
      local_c0 = local_e8;
      lVar10 = 0;
      lVar23 = depth_00;
      while( true ) {
        pdVar7[-1] = 1.97626258336499e-323;
        lVar5 = (long)pdVar7[-1];
        if (lVar23 < 4) {
          lVar5 = lVar23;
        }
        lVar6 = 0;
        if (0 < lVar5) {
          lVar6 = lVar5;
        }
        lVar15 = depth_00 - lVar10;
        if (lVar15 == 0 || depth_00 < lVar10) break;
        pdVar8 = local_c0 + -lVar5;
        lVar3 = -lVar5;
        depth = (long)pdVar7[-1];
        if (lVar15 < 4) {
          depth = lVar15;
        }
        lVar12 = 0;
        while( true ) {
          lVar5 = lVar5 + -1;
          lVar13 = 0;
          if (0 < lVar5) {
            lVar13 = lVar5;
          }
          if (lVar12 == lVar6) break;
          lVar14 = ~(lVar12 + lVar10) + local_50;
          dVar1 = _tri[lVar14 * triStride + lVar14];
          pdVar16 = local_100 + lVar3;
          for (lVar17 = lVar9; lVar17 < lVar4 + lVar9; lVar17 = lVar17 + 1) {
            dVar24 = _other[lVar17 * otherStride + lVar14] * (1.0 / dVar1);
            _other[lVar17 * otherStride + lVar14] = dVar24;
            for (lVar22 = 0; lVar13 != lVar22; lVar22 = lVar22 + 1) {
              pdVar16[lVar22] = pdVar8[lVar22] * -dVar24 + pdVar16[lVar22];
            }
            pdVar16 = pdVar16 + otherStride;
          }
          lVar12 = lVar12 + 1;
          pdVar8 = pdVar8 + -triStride;
        }
        lVar6 = (local_50 - lVar10) - depth;
        pdVar7[-1] = (double)(lVar15 - depth);
        pdVar7[-2] = (double)depth_00;
        pdVar7[-3] = 5.64716539130899e-318;
        gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                  (&local_33,pdVar21,_other + lVar9 * otherStride + lVar6,otherStride,depth,lVar4,
                   (long)pdVar7[-2],(long)pdVar7[-1]);
        lVar5 = lVar15 - depth;
        if (lVar5 != 0 && depth <= lVar15) {
          pdVar7[-2] = 0.0;
          pdVar7[-1] = 0.0;
          pdVar7[-3] = 5.64760016907733e-318;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    (local_31,local_40,_tri + (local_50 - depth_00) + lVar6 * triStride,triStride,
                     depth,lVar5,(long)pdVar7[-2],(long)pdVar7[-1]);
          pdVar7[-2] = (double)local_88;
          pdVar7[-3] = (double)lVar5;
          pdVar7[-4] = 0.0;
          pdVar7[-5] = (double)depth_00;
          pdVar7[-6] = (double)depth;
          pdVar7[-7] = (double)lVar4;
          pdVar7[-8] = (double)depth;
          pdVar7[-9] = 5.64797071831171e-318;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    (&local_32,_other + lVar9 * otherStride + (local_50 - depth_00),otherStride,
                     local_40,pdVar21,lVar5,(long)pdVar7[-8],(long)pdVar7[-7],-1.0,(long)pdVar7[-6],
                     (long)pdVar7[-5],(long)pdVar7[-4],(long)pdVar7[-3],(double *)pdVar7[-2]);
        }
        lVar10 = lVar10 + 4;
        lVar23 = lVar23 + -4;
        local_c0 = local_c0 + ~triStride * 4;
        local_100 = local_100 + -4;
      }
      local_b8 = local_b8 + otherStride * lVar11;
    }
    local_50 = local_50 - lVar2;
    k2 = (long)local_d0;
    lVar9 = local_d8;
    local_70 = _other;
    for (lVar4 = 0; lVar4 < local_50; lVar4 = lVar4 + lVar18) {
      lVar23 = lVar9;
      if (lVar18 <= lVar9) {
        lVar23 = lVar18;
      }
      if (0 < lVar23) {
        pdVar7[-2] = 0.0;
        pdVar7[-1] = 0.0;
        pdVar7[-3] = 5.64903295945027e-318;
        gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                  (local_31,local_40,(double *)k2,triStride,depth_00,lVar23,(long)pdVar7[-2],
                   (long)pdVar7[-1]);
        pdVar7[-2] = (double)local_88;
        pdVar7[-4] = 0.0;
        pdVar7[-3] = 0.0;
        pdVar7[-5] = -NAN;
        pdVar7[-7] = (double)otherSize;
        pdVar7[-6] = -NAN;
        pdVar7[-8] = (double)depth_00;
        pdVar7[-9] = 5.64948255918799e-318;
        gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                  (&local_32,local_70,otherStride,local_40,(double *)cols,lVar23,(long)pdVar7[-8],
                   (long)pdVar7[-7],-1.0,(long)pdVar7[-6],(long)pdVar7[-5],(long)pdVar7[-4],
                   (long)pdVar7[-3],(double *)pdVar7[-2]);
      }
      k2 = k2 + lVar18 * 8;
      local_70 = local_70 + lVar18;
      lVar9 = lVar9 - lVar18;
    }
    local_e8 = (double *)((long)local_e8 + (triStride * 8 ^ 0xfffffffffffffff8U) * lVar2);
    pdVar19 = pdVar19 + -lVar2;
    local_d0 = local_d0 + -(lVar2 * triStride);
    local_d8 = local_d8 - lVar2;
  }
  pdVar7[-1] = 5.65010014124529e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockB_stack_memory_destructor.m_deallocate);
  pdVar7[-1] = 5.65015942912279e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate);
  pdVar7[-1] = 5.65021871700029e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&l1);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * otherStride) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index s  = IsLower ? k2+k1 : i+1;
            Index rs = actualPanelWidth - k - 1; // remaining size

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Index s = IsLower ? i+1 : i-rs;
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }